

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

ssize_t __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::write
          (arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
           *this,char_type *value)

{
  char_type cVar1;
  uint uVar2;
  format_specs *spec;
  char *pcVar3;
  _Distance __n;
  size_t sVar4;
  ssize_t extraout_RAX;
  ssize_t sVar5;
  format_error *this_00;
  size_t sVar6;
  counting_iterator<char> *it;
  char *data;
  str_writer<char> local_20;
  
  if (value != (char_type *)0x0) {
    sVar4 = strlen(value);
    spec = this->specs_;
    if (spec == (format_specs *)0x0) {
      pcVar3 = &(this->writer_).out_.blackhole_;
      sVar6 = 0;
      if (0 < (long)sVar4) {
        sVar6 = sVar4;
        pcVar3 = value + (sVar4 - 1);
      }
      cVar1 = *pcVar3;
      sVar5 = CONCAT71((int7)(sVar4 >> 8),cVar1);
      (this->writer_).out_.count_ = (this->writer_).out_.count_ + sVar6;
      (this->writer_).out_.blackhole_ = cVar1;
    }
    else {
      uVar2 = (spec->super_core_format_specs).precision;
      local_20.size_ = (ulong)uVar2;
      if (sVar4 <= uVar2) {
        local_20.size_ = sVar4;
      }
      if ((int)uVar2 < 0) {
        local_20.size_ = sVar4;
      }
      local_20.s = value;
      basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
      write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::str_writer<char>>
                ((basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
                  *)this,&spec->super_align_spec,&local_20);
      sVar5 = extraout_RAX;
    }
    return sVar5;
  }
  this_00 = (format_error *)__cxa_allocate_exception(0x10);
  format_error::format_error(this_00,"string pointer is null");
  __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void write(const char_type *value) {
    if (!value)
      FMT_THROW(format_error("string pointer is null"));
    auto length = std::char_traits<char_type>::length(value);
    basic_string_view<char_type> sv(value, length);
    specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
  }